

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O3

char * rapidjson::internal::u32toa(uint32_t value,char *buffer)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/j05070415[P]RJson/rapidjson/include/rapidjson/internal/itoa.h"
                  ,0x28,"char *rapidjson::internal::u32toa(uint32_t, char *)");
  }
  if (9999 < value) {
    if (99999999 < value) {
      uVar3 = (ulong)value / 100000000;
      uVar1 = value + (int)uVar3 * -100000000;
      if (value < 1000000000) {
        *buffer = (byte)((ulong)value / 100000000) | 0x30;
        pcVar4 = buffer + 1;
      }
      else {
        *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + uVar3 * 2);
        pcVar4 = buffer + 2;
      }
      *(undefined2 *)pcVar4 =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar1 / 500000 & 0xfffffffe));
      *(undefined2 *)(pcVar4 + 2) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut +
            (ulong)(uVar1 / 10000 + ((uVar1 / 10000 & 0xffff) / 100) * -100 & 0xffff) * 2);
      *(undefined2 *)(pcVar4 + 4) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)((uVar1 % 10000) / 100) * 2);
      *(undefined2 *)(pcVar4 + 6) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)((uVar1 % 10000) % 100) * 2);
      return pcVar4 + 8;
    }
    uVar5 = (ulong)(value / 500000 & 0xfffffffe);
    uVar1 = (value / 10000 + ((value / 10000 & 0xffff) / 100) * -100 & 0xffff) * 2;
    uVar3 = (ulong)(((value % 10000) / 100) * 2);
    uVar2 = ((value % 10000) % 100) * 2;
    if (value < 10000000) {
      if (999999 < value) goto LAB_0010935a;
      if (value < 100000) goto LAB_00109380;
    }
    else {
      *buffer = GetDigitsLut()::cDigitsLut[uVar5];
      buffer = buffer + 1;
LAB_0010935a:
      *buffer = GetDigitsLut()::cDigitsLut[uVar5 + 1];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[uVar1];
    buffer = buffer + 1;
LAB_00109380:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar1 + 1];
    buffer[1] = GetDigitsLut()::cDigitsLut[uVar3];
    buffer[2] = GetDigitsLut()::cDigitsLut[uVar3 + 1];
    buffer[3] = GetDigitsLut()::cDigitsLut[uVar2];
    buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar2 + 1];
    return buffer + 5;
  }
  uVar2 = (value & 0xffff) / 100;
  uVar1 = uVar2 * 2;
  uVar2 = (value + uVar2 * -100 & 0xffff) * 2;
  if (value < 1000) {
    if (99 < value) goto LAB_001092d8;
    if (value < 10) goto LAB_001092fa;
  }
  else {
    *buffer = GetDigitsLut()::cDigitsLut[uVar1];
    buffer = buffer + 1;
LAB_001092d8:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar1 + 1];
    buffer = buffer + 1;
  }
  *buffer = GetDigitsLut()::cDigitsLut[uVar2];
  buffer = buffer + 1;
LAB_001092fa:
  *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar2 + 1];
  return buffer + 1;
}

Assistant:

inline char* u32toa(uint32_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);

    const char* cDigitsLut = GetDigitsLut();

    if (value < 10000) {
        const uint32_t d1 = (value / 100) << 1;
        const uint32_t d2 = (value % 100) << 1;

        if (value >= 1000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 100)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 10)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
    }
    else if (value < 100000000) {
        // value = bbbbcccc
        const uint32_t b = value / 10000;
        const uint32_t c = value % 10000;

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        if (value >= 10000000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 1000000)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 100000)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];

        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    else {
        // value = aabbbbcccc in decimal

        const uint32_t a = value / 100000000; // 1 to 42
        value %= 100000000;

        if (a >= 10) {
            const unsigned i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));

        const uint32_t b = value / 10000; // 0 to 9999
        const uint32_t c = value % 10000; // 0 to 9999

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    return buffer;
}